

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_result_zeroblob64(sqlite3_context *pCtx,u64 n)

{
  Mem *pMem;
  int iVar1;
  
  pMem = pCtx->pOut;
  if ((ulong)(long)pMem->db->aLimit[0] < n) {
    pCtx->isError = 0x12;
    sqlite3VdbeMemSetStr(pMem,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0);
    iVar1 = 0x12;
  }
  else {
    sqlite3VdbeMemSetZeroBlob(pMem,(int)n);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_result_zeroblob64(sqlite3_context *pCtx, u64 n){
  Mem *pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  if( n>(u64)pOut->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(pCtx);
    return SQLITE_TOOBIG;
  }
#ifndef SQLITE_OMIT_INCRBLOB
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
  return SQLITE_OK;
#else
  return sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
#endif
}